

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RewardModelMappingSparse.cpp
# Opt level: O0

string * __thiscall RewardModelMappingSparse::SoftPrint_abi_cxx11_(RewardModelMappingSparse *this)

{
  ostream *poVar1;
  size_t sVar2;
  void *this_00;
  RewardModel *in_RSI;
  string *in_RDI;
  RewardModel *pRVar3;
  double dVar4;
  double dVar5;
  Index ja_i;
  Index s_i;
  double r;
  stringstream ss;
  uint local_1b4;
  uint local_1b0;
  stringstream local_198 [16];
  ostream local_188 [392];
  
  std::__cxx11::stringstream::stringstream(local_198);
  poVar1 = std::operator<<(local_188,(string *)(in_RSI + 1));
  poVar1 = std::operator<<(poVar1,"\t");
  poVar1 = std::operator<<(poVar1,(string *)&in_RSI[2]._m_nrStates);
  poVar1 = std::operator<<(poVar1,"\t");
  poVar1 = std::operator<<(poVar1,"R(");
  poVar1 = std::operator<<(poVar1,(string *)(in_RSI + 1));
  poVar1 = std::operator<<(poVar1,",");
  poVar1 = std::operator<<(poVar1,(string *)&in_RSI[2]._m_nrStates);
  poVar1 = std::operator<<(poVar1,") (rewards of 0 are not printed)");
  dVar4 = (double)std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  local_1b0 = 0;
  while( true ) {
    sVar2 = RewardModel::GetNrStates(in_RSI);
    if (sVar2 <= local_1b0) break;
    local_1b4 = 0;
    while( true ) {
      sVar2 = RewardModel::GetNrJointActions(in_RSI);
      if (sVar2 <= local_1b4) break;
      pRVar3 = in_RSI;
      (**(in_RSI->super_RewardModelDiscreteInterface).super_QTableInterface._vptr_QTableInterface)
                (in_RSI,(ulong)local_1b0,(ulong)local_1b4);
      dVar5 = dVar4;
      std::abs((int)pRVar3);
      if (0.0 < dVar5) {
        poVar1 = (ostream *)std::ostream::operator<<(local_188,local_1b0);
        poVar1 = std::operator<<(poVar1,"\t");
        poVar1 = (ostream *)std::ostream::operator<<(poVar1,local_1b4);
        poVar1 = std::operator<<(poVar1,"\t");
        this_00 = (void *)std::ostream::operator<<(poVar1,dVar4);
        dVar5 = (double)std::ostream::operator<<(this_00,std::endl<char,std::char_traits<char>>);
      }
      dVar4 = dVar5;
      local_1b4 = local_1b4 + 1;
    }
    local_1b0 = local_1b0 + 1;
  }
  std::__cxx11::stringstream::str();
  std::__cxx11::stringstream::~stringstream(local_198);
  return in_RDI;
}

Assistant:

string RewardModelMappingSparse::SoftPrint() const
{
    stringstream ss;
    double r;
    ss << _m_s_str <<"\t"<< _m_ja_str <<"\t"
       << "R(" << _m_s_str <<","<< _m_ja_str
       <<  ") (rewards of 0 are not printed)"<<endl;
    for(Index s_i = 0; s_i < GetNrStates(); s_i++)
        for(Index ja_i = 0; ja_i < GetNrJointActions(); ja_i++)
        {
            r=Get(s_i, ja_i);
            if(std::abs(r)>0)
                ss << s_i << "\t" << ja_i << "\t" << r << endl;
        }
    return(ss.str());
}